

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

void __thiscall QHostAddressPrivate::setAddress(QHostAddressPrivate *this,quint8 *a_)

{
  quint64 qVar1;
  
  this->protocol = '\x01';
  qVar1 = *(quint64 *)(a_ + 8);
  (this->field_1).a6_64.c[0] = *(quint64 *)a_;
  (this->field_1).a6_64.c[1] = qVar1;
  this->a = 0;
  convertToIpv4(&this->a,&(this->field_1).a6,(ConversionMode)0x5);
  return;
}

Assistant:

void QHostAddressPrivate::setAddress(const quint8 *a_)
{
    protocol = QHostAddress::IPv6Protocol;
    memcpy(a6.c, a_, sizeof(a6));
    a = 0;
    convertToIpv4(a, a6, (QHostAddress::ConvertV4MappedToIPv4
                          | QHostAddress::ConvertUnspecifiedAddress));
}